

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

UnresolvedSplitRecord __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
::pop(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
      *this)

{
  UnresolvedSplitRecord *pUVar1;
  uint uVar2;
  UnresolvedSplitRecord *pUVar3;
  TermList TVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 uVar9;
  uint uVar10;
  UnresolvedSplitRecord UVar11;
  
  pUVar3 = this->_data;
  uVar2 = pUVar3->var;
  TVar4._content = (pUVar3->original)._content;
  uVar10 = this->_size - 1;
  this->_size = uVar10;
  if (uVar10 != 0) {
    uVar8 = pUVar3->var;
    uVar9 = *(undefined4 *)&pUVar3->field_0x4;
    uVar5 = (pUVar3->original)._content;
    pUVar1 = pUVar3 + uVar10;
    uVar7 = *(undefined4 *)&pUVar1->field_0x4;
    uVar6 = (pUVar1->original)._content;
    pUVar3->var = pUVar1->var;
    *(undefined4 *)&pUVar3->field_0x4 = uVar7;
    (pUVar3->original)._content = uVar6;
    pUVar3 = pUVar3 + uVar10;
    pUVar3->var = uVar8;
    *(undefined4 *)&pUVar3->field_0x4 = uVar9;
    (pUVar3->original)._content = uVar5;
    bubbleDown(this,1);
  }
  UVar11._4_4_ = 0;
  UVar11.var = uVar2;
  UVar11.original._content = TVar4._content;
  return UVar11;
}

Assistant:

inline
  T pop()
  {
    ASS(!isEmpty());
    T res=_data[0];
    _size--;
    if(_size) {
      std::swap(_data[0],_data[_size]);
      bubbleDown(1);
    }
    _data[_size].~T();
    return res;
  }